

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.h
# Opt level: O1

bool __thiscall
re2::EmptyStringWalker::PostVisit
          (EmptyStringWalker *this,Regexp *re,bool parent_arg,bool pre_arg,bool *child_args,
          int nchild_args)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  
  bVar2 = false;
  switch(re->op_) {
  case '\x02':
  case '\a':
  case '\t':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x15':
    bVar2 = true;
    break;
  case '\x05':
    bVar2 = nchild_args < 1;
    if ((0 < nchild_args) && (*child_args == true)) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if ((uint)nchild_args == uVar3) break;
        uVar1 = uVar3 + 1;
      } while (child_args[uVar3] != false);
      return (uint)nchild_args <= uVar3;
    }
    break;
  case '\x06':
    bVar2 = 0 < nchild_args;
    if ((0 < nchild_args) && (*child_args == false)) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if ((uint)nchild_args == uVar3) break;
        uVar1 = uVar3 + 1;
      } while (child_args[uVar3] == false);
      return uVar3 < (uint)nchild_args;
    }
    break;
  case '\b':
  case '\v':
    return *child_args;
  case '\n':
    bVar2 = true;
    if (*child_args == false) {
      if (re->op_ == '\n') {
        return (re->field_7).field_0.min_ == 0;
      }
      __assert_fail("(op_) == (kRegexpRepeat)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.h",
                    0x147,"int re2::Regexp::min()");
    }
  }
  return bVar2;
}

Assistant:

RegexpOp op() { return static_cast<RegexpOp>(op_); }